

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FinishCoding(Parse *pParse)

{
  sqlite3 *psVar1;
  int *piVar2;
  ExprList *pEVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vdbe *p;
  Op *pOVar7;
  long lVar8;
  ExprList_item *pEVar9;
  uint p1;
  ExprList *pEL;
  long lVar10;
  VTable *zP4;
  
  if (pParse->nested != '\0') {
    return;
  }
  psVar1 = pParse->db;
  if ((psVar1->mallocFailed == '\0') && (pParse->nErr == 0)) {
    p = pParse->pVdbe;
    if ((p != (Vdbe *)0x0) || (p = allocVdbe(pParse), p != (Vdbe *)0x0)) {
      sqlite3VdbeAddOp3(p,0x37,0,0,0);
      if ((psVar1->mallocFailed == '\0') &&
         ((pParse->cookieMask != 0 || (pParse->pConstExpr != (ExprList *)0x0)))) {
        if (p->db->mallocFailed == '\0') {
          pOVar7 = p->aOp;
        }
        else {
          pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar7->p2 = p->nOp;
        if (0 < psVar1->nDb) {
          lVar8 = 0;
          lVar10 = 0;
          do {
            p1 = (uint)lVar10;
            uVar4 = 1 << ((byte)lVar10 & 0x1f);
            if ((pParse->cookieMask >> (p1 & 0x1f) & 1) != 0) {
              p->btreeMask = p->btreeMask | uVar4;
              if ((lVar10 != 1) &&
                 (*(char *)(*(long *)((long)&p->db->aDb->pBt + lVar8) + 0x11) != '\0')) {
                p->lockMask = p->lockMask | uVar4;
              }
              piVar2 = *(int **)((long)&psVar1->aDb->pSchema + lVar8);
              iVar6 = piVar2[1];
              iVar5 = sqlite3VdbeAddOp3(p,2,p1,(uint)((pParse->writeMask >> (p1 & 0x1f) & 1) != 0),
                                        *piVar2);
              if (p->db->mallocFailed == '\0') {
                pOVar7 = p->aOp;
                pOVar7[iVar5].p4type = -3;
                pOVar7[iVar5].p4.i = iVar6;
              }
              if (((psVar1->init).busy == '\0') && (0 < (long)p->nOp)) {
                p->aOp[(long)p->nOp + -1].p5 = 1;
              }
            }
            lVar10 = lVar10 + 1;
            lVar8 = lVar8 + 0x20;
          } while (lVar10 < psVar1->nDb);
        }
        if (0 < pParse->nVtabLock) {
          lVar8 = 0;
          do {
            for (zP4 = pParse->apVtabLock[lVar8]->pVTable; zP4 != (VTable *)0x0; zP4 = zP4->pNext) {
              if (zP4->db == psVar1) goto LAB_0014b55e;
            }
            zP4 = (VTable *)0x0;
LAB_0014b55e:
            iVar6 = sqlite3VdbeAddOp3(p,0x99,0,0,0);
            sqlite3VdbeChangeP4(p,iVar6,(char *)zP4,-0xc);
            lVar8 = lVar8 + 1;
          } while (lVar8 < pParse->nVtabLock);
        }
        pParse->nVtabLock = 0;
        codeTableLocks(pParse);
        sqlite3AutoincrementBegin(pParse);
        pEVar3 = pParse->pConstExpr;
        if ((pEVar3 != (ExprList *)0x0) && (pParse->okConstFactor = '\0', 0 < pEVar3->nExpr)) {
          pEVar9 = pEVar3->a;
          lVar8 = 0;
          do {
            sqlite3ExprCode(pParse,pEVar9->pExpr,(pEVar9->u).iConstExprReg);
            lVar8 = lVar8 + 1;
            pEVar9 = pEVar9 + 1;
          } while (lVar8 < pEVar3->nExpr);
        }
        sqlite3VdbeAddOp3(p,0xd,0,1,0);
      }
      if ((pParse->nErr == 0) && (psVar1->mallocFailed == '\0')) {
        if ((pParse->pAinc != (AutoincInfo *)0x0) && (pParse->nTab == 0)) {
          pParse->nTab = 1;
        }
        sqlite3VdbeMakeReady(p,pParse);
        pParse->rc = 0x65;
        return;
      }
    }
  }
  else if (pParse->rc != 0) {
    return;
  }
  pParse->rc = 1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishCoding(Parse *pParse){
  sqlite3 *db;
  Vdbe *v;

  assert( pParse->pToplevel==0 );
  db = pParse->db;
  if( pParse->nested ) return;
  if( db->mallocFailed || pParse->nErr ){
    if( pParse->rc==SQLITE_OK ) pParse->rc = SQLITE_ERROR;
    return;
  }

  /* Begin by generating some termination code at the end of the
  ** vdbe program
  */
  v = sqlite3GetVdbe(pParse);
  assert( !pParse->isMultiWrite 
       || sqlite3VdbeAssertMayAbort(v, pParse->mayAbort));
  if( v ){
    sqlite3VdbeAddOp0(v, OP_Halt);

#if SQLITE_USER_AUTHENTICATION
    if( pParse->nTableLock>0 && db->init.busy==0 ){
      sqlite3UserAuthInit(db);
      if( db->auth.authLevel<UAUTH_User ){
        sqlite3ErrorMsg(pParse, "user not authenticated");
        pParse->rc = SQLITE_AUTH_USER;
        return;
      }
    }
#endif

    /* The cookie mask contains one bit for each database file open.
    ** (Bit 0 is for main, bit 1 is for temp, and so forth.)  Bits are
    ** set for each database that is used.  Generate code to start a
    ** transaction on each used database and to verify the schema cookie
    ** on each used database.
    */
    if( db->mallocFailed==0 
     && (DbMaskNonZero(pParse->cookieMask) || pParse->pConstExpr)
    ){
      int iDb, i;
      assert( sqlite3VdbeGetOp(v, 0)->opcode==OP_Init );
      sqlite3VdbeJumpHere(v, 0);
      for(iDb=0; iDb<db->nDb; iDb++){
        Schema *pSchema;
        if( DbMaskTest(pParse->cookieMask, iDb)==0 ) continue;
        sqlite3VdbeUsesBtree(v, iDb);
        pSchema = db->aDb[iDb].pSchema;
        sqlite3VdbeAddOp4Int(v,
          OP_Transaction,                    /* Opcode */
          iDb,                               /* P1 */
          DbMaskTest(pParse->writeMask,iDb), /* P2 */
          pSchema->schema_cookie,            /* P3 */
          pSchema->iGeneration               /* P4 */
        );
        if( db->init.busy==0 ) sqlite3VdbeChangeP5(v, 1);
        VdbeComment((v,
              "usesStmtJournal=%d", pParse->mayAbort && pParse->isMultiWrite));
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      for(i=0; i<pParse->nVtabLock; i++){
        char *vtab = (char *)sqlite3GetVTable(db, pParse->apVtabLock[i]);
        sqlite3VdbeAddOp4(v, OP_VBegin, 0, 0, 0, vtab, P4_VTAB);
      }
      pParse->nVtabLock = 0;
#endif

      /* Once all the cookies have been verified and transactions opened, 
      ** obtain the required table-locks. This is a no-op unless the 
      ** shared-cache feature is enabled.
      */
      codeTableLocks(pParse);

      /* Initialize any AUTOINCREMENT data structures required.
      */
      sqlite3AutoincrementBegin(pParse);

      /* Code constant expressions that where factored out of inner loops */
      if( pParse->pConstExpr ){
        ExprList *pEL = pParse->pConstExpr;
        pParse->okConstFactor = 0;
        for(i=0; i<pEL->nExpr; i++){
          sqlite3ExprCode(pParse, pEL->a[i].pExpr, pEL->a[i].u.iConstExprReg);
        }
      }

      /* Finally, jump back to the beginning of the executable code. */
      sqlite3VdbeGoto(v, 1);
    }
  }


  /* Get the VDBE program ready for execution
  */
  if( v && pParse->nErr==0 && !db->mallocFailed ){
    assert( pParse->iCacheLevel==0 );  /* Disables and re-enables match */
    /* A minimum of one cursor is required if autoincrement is used
    *  See ticket [a696379c1f08866] */
    if( pParse->pAinc!=0 && pParse->nTab==0 ) pParse->nTab = 1;
    sqlite3VdbeMakeReady(v, pParse);
    pParse->rc = SQLITE_DONE;
  }else{
    pParse->rc = SQLITE_ERROR;
  }
}